

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngtexture.cpp
# Opt level: O1

void __thiscall FPNGTexture::~FPNGTexture(FPNGTexture *this)

{
  BYTE *pBVar1;
  
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FPNGTexture_0070e368;
  if (this->Pixels != (BYTE *)0x0) {
    operator_delete__(this->Pixels);
    this->Pixels = (BYTE *)0x0;
  }
  if (this->Spans != (Span **)0x0) {
    FTexture::FreeSpans(&this->super_FTexture,this->Spans);
    this->Spans = (Span **)0x0;
  }
  pBVar1 = this->PaletteMap;
  if (pBVar1 != FTexture::GrayMap && pBVar1 != (BYTE *)0x0) {
    operator_delete__(pBVar1);
    this->PaletteMap = (BYTE *)0x0;
  }
  FString::~FString(&this->SourceFile);
  FTexture::~FTexture(&this->super_FTexture);
  return;
}

Assistant:

FPNGTexture::~FPNGTexture ()
{
	Unload ();
	if (Spans != NULL)
	{
		FreeSpans (Spans);
		Spans = NULL;
	}
	if (PaletteMap != NULL && PaletteMap != GrayMap)
	{
		delete[] PaletteMap;
		PaletteMap = NULL;
	}
}